

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser * init_parse_mon_spell(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_mon_spell_name);
  parser_reg(p,"msgt sym type",parse_mon_spell_message_type);
  parser_reg(p,"hit uint hit",parse_mon_spell_hit);
  parser_reg(p,"effect sym eff ?sym type ?int radius ?int other",parse_mon_spell_effect);
  parser_reg(p,"effect-yx int y int x",parse_mon_spell_effect_yx);
  parser_reg(p,"dice str dice",parse_mon_spell_dice);
  parser_reg(p,"expr sym name sym base str expr",parse_mon_spell_expr);
  parser_reg(p,"power-cutoff int power",parse_mon_spell_power_cutoff);
  parser_reg(p,"lore str text",parse_mon_spell_lore_desc);
  parser_reg(p,"lore-color-base sym color",parse_mon_spell_lore_color);
  parser_reg(p,"lore-color-resist sym color",parse_mon_spell_lore_color_resist);
  parser_reg(p,"lore-color-immune sym color",parse_mon_spell_lore_color_immune);
  parser_reg(p,"message-vis str text",parse_mon_spell_message);
  parser_reg(p,"message-invis str text",parse_mon_spell_blind_message);
  parser_reg(p,"message-miss str text",parse_mon_spell_miss_message);
  parser_reg(p,"message-save str text",parse_mon_spell_save_message);
  return p;
}

Assistant:

static struct parser *init_parse_mon_spell(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_mon_spell_name);
	parser_reg(p, "msgt sym type", parse_mon_spell_message_type);
	parser_reg(p, "hit uint hit", parse_mon_spell_hit);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_mon_spell_effect);
	parser_reg(p, "effect-yx int y int x", parse_mon_spell_effect_yx);
	parser_reg(p, "dice str dice", parse_mon_spell_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_mon_spell_expr);
	parser_reg(p, "power-cutoff int power", parse_mon_spell_power_cutoff);
	parser_reg(p, "lore str text", parse_mon_spell_lore_desc);
	parser_reg(p, "lore-color-base sym color", parse_mon_spell_lore_color);
	parser_reg(p, "lore-color-resist sym color", parse_mon_spell_lore_color_resist);
	parser_reg(p, "lore-color-immune sym color", parse_mon_spell_lore_color_immune);
	parser_reg(p, "message-vis str text", parse_mon_spell_message);
	parser_reg(p, "message-invis str text", parse_mon_spell_blind_message);
	parser_reg(p, "message-miss str text", parse_mon_spell_miss_message);
	parser_reg(p, "message-save str text", parse_mon_spell_save_message);
	return p;
}